

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::WriteFramesLessThan(Segment *this,uint64_t timestamp)

{
  Cluster *this_00;
  Frame *this_01;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  int64_t iVar4;
  uint64_t uVar5;
  int local_48;
  int32_t i_1;
  int32_t new_frames_size;
  Frame *frame_prev;
  Frame *frame_curr;
  int32_t i;
  int32_t shift_left;
  Cluster *cluster;
  uint64_t timestamp_local;
  Segment *this_local;
  
  if ((0 < this->frames_size_) && (0 < this->cluster_list_size_)) {
    if (this->frames_ == (Frame **)0x0) {
      return false;
    }
    this_00 = this->cluster_list_[this->cluster_list_size_ + -1];
    if (this_00 == (Cluster *)0x0) {
      return false;
    }
    frame_curr._4_4_ = 0;
    frame_curr._0_4_ = 1;
    while (((int)frame_curr < this->frames_size_ &&
           (uVar3 = Frame::timestamp(this->frames_[(int)frame_curr]), uVar3 <= timestamp))) {
      this_01 = this->frames_[(int)frame_curr + -1];
      iVar4 = Frame::discard_padding(this_01);
      if (iVar4 != 0) {
        this->doc_type_version_ = 4;
      }
      bVar1 = Cluster::AddFrame(this_00,this_01);
      if (bVar1) {
        if (((this->new_cuepoint_ & 1U) != 0) &&
           (uVar3 = this->cues_track_, uVar5 = Frame::track_number(this_01), uVar3 == uVar5)) {
          uVar3 = Frame::timestamp(this_01);
          bVar1 = AddCuePoint(this,uVar3,this->cues_track_);
          if (!bVar1) {
            if (this_01 != (Frame *)0x0) {
              Frame::~Frame(this_01);
              operator_delete(this_01);
            }
            goto LAB_00145b64;
          }
        }
        frame_curr._4_4_ = frame_curr._4_4_ + 1;
        uVar3 = Frame::timestamp(this_01);
        if (this->last_timestamp_ < uVar3) {
          uVar3 = Frame::timestamp(this_01);
          this->last_timestamp_ = uVar3;
          uVar3 = Frame::timestamp(this_01);
          uVar5 = Frame::track_number(this_01);
          this->last_track_timestamp_[uVar5 - 1] = uVar3;
        }
        if (this_01 != (Frame *)0x0) {
          Frame::~Frame(this_01);
          operator_delete(this_01);
        }
      }
      else if (this_01 != (Frame *)0x0) {
        Frame::~Frame(this_01);
        operator_delete(this_01);
      }
LAB_00145b64:
      frame_curr._0_4_ = (int)frame_curr + 1;
    }
    if (0 < frame_curr._4_4_) {
      if (this->frames_size_ <= frame_curr._4_4_) {
        return false;
      }
      iVar2 = this->frames_size_ - frame_curr._4_4_;
      for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
        this->frames_[local_48] = this->frames_[local_48 + frame_curr._4_4_];
      }
      this->frames_size_ = iVar2;
    }
  }
  return true;
}

Assistant:

bool Segment::WriteFramesLessThan(uint64_t timestamp) {
  // Check |cluster_list_size_| to see if this is the first cluster. If it is
  // the first cluster the audio frames that are less than the first video
  // timesatmp will be written in a later step.
  if (frames_size_ > 0 && cluster_list_size_ > 0) {
    if (!frames_)
      return false;

    Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
    if (!cluster)
      return false;

    int32_t shift_left = 0;

    // TODO(fgalligan): Change this to use the durations of frames instead of
    // the next frame's start time if the duration is accurate.
    for (int32_t i = 1; i < frames_size_; ++i) {
      const Frame* const frame_curr = frames_[i];

      if (frame_curr->timestamp() > timestamp)
        break;

      const Frame* const frame_prev = frames_[i - 1];
      if (frame_prev->discard_padding() != 0)
        doc_type_version_ = 4;
      if (!cluster->AddFrame(frame_prev)) {
        delete frame_prev;
        continue;
      }

      if (new_cuepoint_ && cues_track_ == frame_prev->track_number()) {
        if (!AddCuePoint(frame_prev->timestamp(), cues_track_)) {
          delete frame_prev;
          continue;
        }
      }

      ++shift_left;
      if (frame_prev->timestamp() > last_timestamp_) {
        last_timestamp_ = frame_prev->timestamp();
        last_track_timestamp_[frame_prev->track_number() - 1] =
            frame_prev->timestamp();
      }

      delete frame_prev;
    }

    if (shift_left > 0) {
      if (shift_left >= frames_size_)
        return false;

      const int32_t new_frames_size = frames_size_ - shift_left;
      for (int32_t i = 0; i < new_frames_size; ++i) {
        frames_[i] = frames_[i + shift_left];
      }

      frames_size_ = new_frames_size;
    }
  }

  return true;
}